

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGraphVizWriter.cxx
# Opt level: O1

void __thiscall
cmGraphVizWriter::ReadSettings
          (cmGraphVizWriter *this,char *settingsFileName,char *fallbackSettingsFileName)

{
  char *pcVar1;
  auto_ptr<cmMakefile> aVar2;
  undefined8 uVar3;
  bool bVar4;
  cmMakefile *this_00;
  cmLocalGenerator *pcVar5;
  size_t sVar6;
  char *pcVar7;
  ostream *poVar8;
  pointer puVar9;
  auto_ptr<cmMakefile> mf;
  RegularExpression currentRegex;
  string currentRegexString;
  string ignoreTargetsRegexes;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ignoreTargetsRegExVector;
  cmGlobalGenerator ggi;
  cmake cm;
  auto_ptr<cmMakefile> local_958;
  cmLocalGenerator *local_950;
  undefined1 local_948 [16];
  undefined1 local_938 [192];
  pointer local_878;
  pointer local_870;
  undefined1 local_868 [56];
  pointer puStack_830;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_828;
  undefined1 local_818 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_808 [82];
  cmake local_2e0;
  
  cmake::cmake(&local_2e0);
  local_818._0_8_ = local_808;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_818,"");
  cmake::SetHomeDirectory(&local_2e0,(string *)local_818);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_818._0_8_ != local_808) {
    operator_delete((void *)local_818._0_8_,local_808[0]._M_allocated_capacity + 1);
  }
  local_818._0_8_ = local_808;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_818,"");
  cmake::SetHomeOutputDirectory(&local_2e0,(string *)local_818);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_818._0_8_ != local_808) {
    operator_delete((void *)local_818._0_8_,local_808[0]._M_allocated_capacity + 1);
  }
  local_808[0]._M_allocated_capacity = local_2e0.CurrentSnapshot.Position.Position;
  local_818._0_8_ = local_2e0.CurrentSnapshot.State;
  local_818._8_8_ = local_2e0.CurrentSnapshot.Position.Tree;
  cmState::Snapshot::SetDefaultDefinitions((Snapshot *)local_818);
  cmGlobalGenerator::cmGlobalGenerator((cmGlobalGenerator *)local_818,&local_2e0);
  this_00 = (cmMakefile *)operator_new(0x730);
  local_938._0_8_ = local_2e0.CurrentSnapshot.Position.Position;
  local_948._0_8_ = local_2e0.CurrentSnapshot.State;
  local_948._8_8_ = local_2e0.CurrentSnapshot.Position.Tree;
  cmMakefile::cmMakefile(this_00,(cmGlobalGenerator *)local_818,(Snapshot *)local_948);
  local_958.x_ = this_00;
  pcVar5 = cmGlobalGenerator::CreateLocalGenerator((cmGlobalGenerator *)local_818,this_00);
  bVar4 = cmsys::SystemTools::FileExists(settingsFileName);
  if (!bVar4) {
    bVar4 = cmsys::SystemTools::FileExists(fallbackSettingsFileName);
    settingsFileName = fallbackSettingsFileName;
    if (!bVar4) goto LAB_003b327c;
  }
  bVar4 = cmMakefile::ReadListFile(local_958.x_,settingsFileName);
  if (bVar4) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Reading GraphViz options file: ",0x1f);
    if (settingsFileName == (char *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x5d9768);
    }
    else {
      sVar6 = strlen(settingsFileName);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,settingsFileName,sVar6);
    }
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'h');
    std::ostream::put('h');
    std::ostream::flush();
    aVar2.x_ = local_958.x_;
    local_950 = pcVar5;
    local_948._0_8_ = (cmState *)local_938;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_948,"GRAPHVIZ_GRAPH_TYPE","");
    pcVar7 = cmMakefile::GetDefinition(aVar2.x_,(string *)local_948);
    if ((cmState *)local_948._0_8_ != (cmState *)local_938) {
      operator_delete((void *)local_948._0_8_,local_938._0_8_ + 1);
    }
    if (pcVar7 != (char *)0x0) {
      pcVar1 = (char *)(this->GraphType)._M_string_length;
      strlen(pcVar7);
      std::__cxx11::string::_M_replace((ulong)this,0,pcVar1,(ulong)pcVar7);
    }
    aVar2.x_ = local_958.x_;
    local_948._0_8_ = (cmState *)local_938;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_948,"GRAPHVIZ_GRAPH_NAME","");
    pcVar7 = cmMakefile::GetDefinition(aVar2.x_,(string *)local_948);
    if ((cmState *)local_948._0_8_ != (cmState *)local_938) {
      operator_delete((void *)local_948._0_8_,local_938._0_8_ + 1);
    }
    if (pcVar7 != (char *)0x0) {
      pcVar1 = (char *)(this->GraphName)._M_string_length;
      strlen(pcVar7);
      std::__cxx11::string::_M_replace((ulong)&this->GraphName,0,pcVar1,(ulong)pcVar7);
    }
    aVar2.x_ = local_958.x_;
    local_948._0_8_ = (cmState *)local_938;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_948,"GRAPHVIZ_GRAPH_HEADER","");
    pcVar7 = cmMakefile::GetDefinition(aVar2.x_,(string *)local_948);
    if ((cmState *)local_948._0_8_ != (cmState *)local_938) {
      operator_delete((void *)local_948._0_8_,local_938._0_8_ + 1);
    }
    if (pcVar7 != (char *)0x0) {
      pcVar1 = (char *)(this->GraphHeader)._M_string_length;
      strlen(pcVar7);
      std::__cxx11::string::_M_replace((ulong)&this->GraphHeader,0,pcVar1,(ulong)pcVar7);
    }
    aVar2.x_ = local_958.x_;
    local_948._0_8_ = (cmState *)local_938;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_948,"GRAPHVIZ_NODE_PREFIX","");
    pcVar7 = cmMakefile::GetDefinition(aVar2.x_,(string *)local_948);
    if ((cmState *)local_948._0_8_ != (cmState *)local_938) {
      operator_delete((void *)local_948._0_8_,local_938._0_8_ + 1);
    }
    if (pcVar7 != (char *)0x0) {
      pcVar1 = (char *)(this->GraphNodePrefix)._M_string_length;
      strlen(pcVar7);
      std::__cxx11::string::_M_replace((ulong)&this->GraphNodePrefix,0,pcVar1,(ulong)pcVar7);
    }
    aVar2.x_ = local_958.x_;
    local_948._0_8_ = (cmState *)local_938;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_948,"GRAPHVIZ_EXECUTABLES","");
    pcVar7 = cmMakefile::GetDefinition(aVar2.x_,(string *)local_948);
    if ((cmState *)local_948._0_8_ != (cmState *)local_938) {
      operator_delete((void *)local_948._0_8_,local_938._0_8_ + 1);
    }
    aVar2.x_ = local_958.x_;
    if (pcVar7 != (char *)0x0) {
      local_948._0_8_ = (cmState *)local_938;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_948,"GRAPHVIZ_EXECUTABLES","")
      ;
      bVar4 = cmMakefile::IsOn(aVar2.x_,(string *)local_948);
      this->GenerateForExecutables = bVar4;
      if ((cmState *)local_948._0_8_ != (cmState *)local_938) {
        operator_delete((void *)local_948._0_8_,local_938._0_8_ + 1);
      }
    }
    aVar2.x_ = local_958.x_;
    local_948._0_8_ = (cmState *)local_938;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_948,"GRAPHVIZ_STATIC_LIBS","");
    pcVar7 = cmMakefile::GetDefinition(aVar2.x_,(string *)local_948);
    if ((cmState *)local_948._0_8_ != (cmState *)local_938) {
      operator_delete((void *)local_948._0_8_,local_938._0_8_ + 1);
    }
    aVar2.x_ = local_958.x_;
    if (pcVar7 != (char *)0x0) {
      local_948._0_8_ = (cmState *)local_938;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_948,"GRAPHVIZ_STATIC_LIBS","")
      ;
      bVar4 = cmMakefile::IsOn(aVar2.x_,(string *)local_948);
      this->GenerateForStaticLibs = bVar4;
      if ((cmState *)local_948._0_8_ != (cmState *)local_938) {
        operator_delete((void *)local_948._0_8_,local_938._0_8_ + 1);
      }
    }
    aVar2.x_ = local_958.x_;
    local_948._0_8_ = (cmState *)local_938;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_948,"GRAPHVIZ_SHARED_LIBS","");
    pcVar7 = cmMakefile::GetDefinition(aVar2.x_,(string *)local_948);
    if ((cmState *)local_948._0_8_ != (cmState *)local_938) {
      operator_delete((void *)local_948._0_8_,local_938._0_8_ + 1);
    }
    aVar2.x_ = local_958.x_;
    if (pcVar7 != (char *)0x0) {
      local_948._0_8_ = (cmState *)local_938;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_948,"GRAPHVIZ_SHARED_LIBS","")
      ;
      bVar4 = cmMakefile::IsOn(aVar2.x_,(string *)local_948);
      this->GenerateForSharedLibs = bVar4;
      if ((cmState *)local_948._0_8_ != (cmState *)local_938) {
        operator_delete((void *)local_948._0_8_,local_938._0_8_ + 1);
      }
    }
    aVar2.x_ = local_958.x_;
    local_948._0_8_ = (cmState *)local_938;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_948,"GRAPHVIZ_MODULE_LIBS","");
    pcVar7 = cmMakefile::GetDefinition(aVar2.x_,(string *)local_948);
    if ((cmState *)local_948._0_8_ != (cmState *)local_938) {
      operator_delete((void *)local_948._0_8_,local_938._0_8_ + 1);
    }
    aVar2.x_ = local_958.x_;
    if (pcVar7 != (char *)0x0) {
      local_948._0_8_ = (cmState *)local_938;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_948,"GRAPHVIZ_MODULE_LIBS","")
      ;
      bVar4 = cmMakefile::IsOn(aVar2.x_,(string *)local_948);
      this->GenerateForModuleLibs = bVar4;
      if ((cmState *)local_948._0_8_ != (cmState *)local_938) {
        operator_delete((void *)local_948._0_8_,local_938._0_8_ + 1);
      }
    }
    aVar2.x_ = local_958.x_;
    local_948._0_8_ = (cmState *)local_938;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_948,"GRAPHVIZ_EXTERNAL_LIBS","")
    ;
    pcVar7 = cmMakefile::GetDefinition(aVar2.x_,(string *)local_948);
    if ((cmState *)local_948._0_8_ != (cmState *)local_938) {
      operator_delete((void *)local_948._0_8_,local_938._0_8_ + 1);
    }
    aVar2.x_ = local_958.x_;
    if (pcVar7 != (char *)0x0) {
      local_948._0_8_ = (cmState *)local_938;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_948,"GRAPHVIZ_EXTERNAL_LIBS","");
      bVar4 = cmMakefile::IsOn(aVar2.x_,(string *)local_948);
      this->GenerateForExternals = bVar4;
      if ((cmState *)local_948._0_8_ != (cmState *)local_938) {
        operator_delete((void *)local_948._0_8_,local_938._0_8_ + 1);
      }
    }
    aVar2.x_ = local_958.x_;
    local_948._0_8_ = (cmState *)local_938;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_948,"GRAPHVIZ_GENERATE_PER_TARGET","");
    pcVar7 = cmMakefile::GetDefinition(aVar2.x_,(string *)local_948);
    if ((cmState *)local_948._0_8_ != (cmState *)local_938) {
      operator_delete((void *)local_948._0_8_,local_938._0_8_ + 1);
    }
    aVar2.x_ = local_958.x_;
    if (pcVar7 != (char *)0x0) {
      local_948._0_8_ = (cmState *)local_938;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_948,"GRAPHVIZ_GENERATE_PER_TARGET","");
      bVar4 = cmMakefile::IsOn(aVar2.x_,(string *)local_948);
      this->GeneratePerTarget = bVar4;
      if ((cmState *)local_948._0_8_ != (cmState *)local_938) {
        operator_delete((void *)local_948._0_8_,local_938._0_8_ + 1);
      }
    }
    aVar2.x_ = local_958.x_;
    local_948._0_8_ = (cmState *)local_938;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_948,"GRAPHVIZ_GENERATE_DEPENDERS","");
    pcVar7 = cmMakefile::GetDefinition(aVar2.x_,(string *)local_948);
    if ((cmState *)local_948._0_8_ != (cmState *)local_938) {
      operator_delete((void *)local_948._0_8_,local_938._0_8_ + 1);
    }
    aVar2.x_ = local_958.x_;
    if (pcVar7 != (char *)0x0) {
      local_948._0_8_ = (cmState *)local_938;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_948,"GRAPHVIZ_GENERATE_DEPENDERS","");
      bVar4 = cmMakefile::IsOn(aVar2.x_,(string *)local_948);
      this->GenerateDependers = bVar4;
      if ((cmState *)local_948._0_8_ != (cmState *)local_938) {
        operator_delete((void *)local_948._0_8_,local_938._0_8_ + 1);
      }
    }
    aVar2.x_ = local_958.x_;
    local_868._16_8_ = local_868 + 0x20;
    local_868._24_8_ = (pointer)0x0;
    local_868[0x20] = '\0';
    local_948._0_8_ = (cmState *)local_938;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_948,"GRAPHVIZ_IGNORE_TARGETS","");
    pcVar7 = cmMakefile::GetDefinition(aVar2.x_,(string *)local_948);
    if ((cmState *)local_948._0_8_ != (cmState *)local_938) {
      operator_delete((void *)local_948._0_8_,local_938._0_8_ + 1);
    }
    uVar3 = local_868._24_8_;
    pcVar5 = local_950;
    if (pcVar7 != (char *)0x0) {
      strlen(pcVar7);
      std::__cxx11::string::_M_replace((ulong)(local_868 + 0x10),0,(char *)uVar3,(ulong)pcVar7);
    }
    std::vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>::clear
              (&this->TargetsToIgnoreRegex);
    if ((pointer)local_868._24_8_ != (pointer)0x0) {
      local_868._48_8_ = (pointer)0x0;
      puStack_830 = (pointer)0x0;
      local_828._M_allocated_capacity = 0;
      cmSystemTools::ExpandListArgument
                ((string *)(local_868 + 0x10),
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)(local_868 + 0x30),false);
      if ((pointer)local_868._48_8_ != puStack_830) {
        puVar9 = (pointer)local_868._48_8_;
        do {
          local_878 = (pointer)local_868;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_878,*puVar9,*puVar9 + puVar9[1]);
          local_938._168_8_ = (cmCacheManager *)0x0;
          bVar4 = cmsys::RegularExpression::compile
                            ((RegularExpression *)local_948,(char *)local_878);
          if (!bVar4) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,"Could not compile bad regex \"",0x1d);
            poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)&std::cerr,(char *)local_878,(long)local_870);
            std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\"",1);
            std::ios::widen((char)poVar8->_vptr_basic_ostream[-3] + (char)poVar8);
            std::ostream::put((char)poVar8);
            std::ostream::flush();
          }
          std::vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>::
          push_back(&this->TargetsToIgnoreRegex,(RegularExpression *)local_948);
          if ((cmCacheManager *)local_938._168_8_ != (cmCacheManager *)0x0) {
            operator_delete__((void *)local_938._168_8_);
          }
          if (local_878 != (pointer)local_868) {
            operator_delete(local_878,
                            (ulong)((long)&(((vector<cmState::SnapshotDataType,_std::allocator<cmState::SnapshotDataType>_>
                                              *)local_868._0_8_)->
                                           super__Vector_base<cmState::SnapshotDataType,_std::allocator<cmState::SnapshotDataType>_>
                                           )._M_impl.super__Vector_impl_data._M_start + 1));
          }
          puVar9 = puVar9 + 4;
        } while (puVar9 != puStack_830);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(local_868 + 0x30));
      pcVar5 = local_950;
    }
    if ((pointer)local_868._16_8_ != (pointer)(local_868 + 0x20)) {
      operator_delete((void *)local_868._16_8_,CONCAT71(local_868._33_7_,local_868[0x20]) + 1);
    }
  }
  else {
    cmSystemTools::Error
              ("Problem opening GraphViz options file: ",settingsFileName,(char *)0x0,(char *)0x0);
  }
LAB_003b327c:
  if (pcVar5 != (cmLocalGenerator *)0x0) {
    (*pcVar5->_vptr_cmLocalGenerator[1])(pcVar5);
  }
  cmsys::auto_ptr<cmMakefile>::~auto_ptr(&local_958);
  cmGlobalGenerator::~cmGlobalGenerator((cmGlobalGenerator *)local_818);
  cmake::~cmake(&local_2e0);
  return;
}

Assistant:

void cmGraphVizWriter::ReadSettings(const char* settingsFileName,
                                    const char* fallbackSettingsFileName)
{
  cmake cm;
  cm.SetHomeDirectory("");
  cm.SetHomeOutputDirectory("");
  cm.GetCurrentSnapshot().SetDefaultDefinitions();
  cmGlobalGenerator ggi(&cm);
  cmsys::auto_ptr<cmMakefile> mf(
        new cmMakefile(&ggi, cm.GetCurrentSnapshot()));
  cmsys::auto_ptr<cmLocalGenerator> lg(ggi.CreateLocalGenerator(mf.get()));

  const char* inFileName = settingsFileName;

  if ( !cmSystemTools::FileExists(inFileName) )
    {
    inFileName = fallbackSettingsFileName;
    if ( !cmSystemTools::FileExists(inFileName) )
      {
      return;
      }
    }

  if ( !mf->ReadListFile(inFileName) )
    {
    cmSystemTools::Error("Problem opening GraphViz options file: ",
                         inFileName);
    return;
    }

  std::cout << "Reading GraphViz options file: " << inFileName << std::endl;

#define __set_if_set(var, cmakeDefinition) \
  { \
  const char* value = mf->GetDefinition(cmakeDefinition); \
  if ( value ) \
    { \
    var = value; \
    } \
  }

  __set_if_set(this->GraphType, "GRAPHVIZ_GRAPH_TYPE");
  __set_if_set(this->GraphName, "GRAPHVIZ_GRAPH_NAME");
  __set_if_set(this->GraphHeader, "GRAPHVIZ_GRAPH_HEADER");
  __set_if_set(this->GraphNodePrefix, "GRAPHVIZ_NODE_PREFIX");

#define __set_bool_if_set(var, cmakeDefinition) \
  { \
  const char* value = mf->GetDefinition(cmakeDefinition); \
  if ( value ) \
    { \
    var = mf->IsOn(cmakeDefinition); \
    } \
  }

  __set_bool_if_set(this->GenerateForExecutables, "GRAPHVIZ_EXECUTABLES");
  __set_bool_if_set(this->GenerateForStaticLibs, "GRAPHVIZ_STATIC_LIBS");
  __set_bool_if_set(this->GenerateForSharedLibs, "GRAPHVIZ_SHARED_LIBS");
  __set_bool_if_set(this->GenerateForModuleLibs, "GRAPHVIZ_MODULE_LIBS");
  __set_bool_if_set(this->GenerateForExternals, "GRAPHVIZ_EXTERNAL_LIBS");
  __set_bool_if_set(this->GeneratePerTarget, "GRAPHVIZ_GENERATE_PER_TARGET");
  __set_bool_if_set(this->GenerateDependers, "GRAPHVIZ_GENERATE_DEPENDERS");

  std::string ignoreTargetsRegexes;
  __set_if_set(ignoreTargetsRegexes, "GRAPHVIZ_IGNORE_TARGETS");

  this->TargetsToIgnoreRegex.clear();
  if (!ignoreTargetsRegexes.empty())
    {
    std::vector<std::string> ignoreTargetsRegExVector;
    cmSystemTools::ExpandListArgument(ignoreTargetsRegexes,
                                      ignoreTargetsRegExVector);
    for(std::vector<std::string>::const_iterator itvIt
                                            = ignoreTargetsRegExVector.begin();
        itvIt != ignoreTargetsRegExVector.end();
        ++ itvIt )
      {
      std::string currentRegexString(*itvIt);
      cmsys::RegularExpression currentRegex;
      if (!currentRegex.compile(currentRegexString.c_str()))
        {
        std::cerr << "Could not compile bad regex \"" << currentRegexString
                  << "\"" << std::endl;
        }
      this->TargetsToIgnoreRegex.push_back(currentRegex);
      }
    }

}